

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O0

CURLcode Curl_build_unencoding_stack(Curl_easy *data,char *enclist,int is_transfer)

{
  char *first;
  int iVar1;
  size_t sVar2;
  bool bVar3;
  Curl_cwriter *local_50;
  Curl_cwriter *writer;
  Curl_cwtype *cwt;
  size_t namelen;
  char *name;
  Curl_cwriter_phase local_28;
  CURLcode result;
  Curl_cwriter_phase phase;
  int is_transfer_local;
  char *enclist_local;
  Curl_easy *data_local;
  
  local_28 = CURL_CW_CONTENT_DECODE;
  _phase = enclist;
  enclist_local = (char *)data;
  result = is_transfer;
  if (is_transfer != 0) {
    local_28 = CURL_CW_TRANSFER_DECODE;
  }
  do {
    while( true ) {
      first = _phase;
      bVar3 = true;
      if ((*_phase != ' ') && (bVar3 = true, *_phase != '\t')) {
        bVar3 = *_phase == ',';
      }
      if (!bVar3) break;
      _phase = _phase + 1;
    }
    namelen = (size_t)_phase;
    cwt = (Curl_cwtype *)0x0;
    while( true ) {
      bVar3 = false;
      if (*_phase != '\0') {
        bVar3 = *_phase != ',';
      }
      if (!bVar3) break;
      if (((*_phase != ' ') && (*_phase != '\t')) && ((*_phase < '\n' || ('\r' < *_phase)))) {
        cwt = (Curl_cwtype *)(_phase + (1 - (long)first));
      }
      _phase = _phase + 1;
    }
    if (cwt != (Curl_cwtype *)0x0) {
      if ((((result != CURLE_OK) && ((*(ulong *)(enclist_local + 0xa52) >> 0x16 & 1) == 0)) &&
          ((cwt != (Curl_cwtype *)0x7 || (iVar1 = curl_strnequal(first,"chunked",7), iVar1 == 0))))
         || ((result == CURLE_OK && ((*(ulong *)(enclist_local + 0xa52) >> 0x24 & 1) != 0)))) {
        return CURLE_OK;
      }
      sVar2 = Curl_cwriter_count((Curl_easy *)enclist_local,local_28);
      if (4 < sVar2 + 1) {
        Curl_failf((Curl_easy *)enclist_local,
                   "Reject response due to more than %u content encodings",5);
        return CURLE_BAD_CONTENT_ENCODING;
      }
      writer = (Curl_cwriter *)find_unencode_writer((char *)namelen,(size_t)cwt,local_28);
      if ((Curl_cwtype *)writer == (Curl_cwtype *)0x0) {
        writer = (Curl_cwriter *)&error_writer;
      }
      name._4_4_ = Curl_cwriter_create(&local_50,(Curl_easy *)enclist_local,(Curl_cwtype *)writer,
                                       local_28);
      if (name._4_4_ != CURLE_OK) {
        return name._4_4_;
      }
      name._4_4_ = Curl_cwriter_add((Curl_easy *)enclist_local,local_50);
      if (name._4_4_ != CURLE_OK) {
        Curl_cwriter_free((Curl_easy *)enclist_local,local_50);
        return name._4_4_;
      }
      name._4_4_ = 0;
    }
    if (*_phase == '\0') {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

CURLcode Curl_build_unencoding_stack(struct Curl_easy *data,
                                     const char *enclist, int is_transfer)
{
  Curl_cwriter_phase phase = is_transfer?
                             CURL_CW_TRANSFER_DECODE:CURL_CW_CONTENT_DECODE;
  CURLcode result;

  do {
    const char *name;
    size_t namelen;

    /* Parse a single encoding name. */
    while(ISBLANK(*enclist) || *enclist == ',')
      enclist++;

    name = enclist;

    for(namelen = 0; *enclist && *enclist != ','; enclist++)
      if(!ISSPACE(*enclist))
        namelen = enclist - name + 1;

    if(namelen) {
      const struct Curl_cwtype *cwt;
      struct Curl_cwriter *writer;

      /* if we skip the decoding in this phase, do not look further.
       * Exception is "chunked" transfer-encoding which always must happen */
      if((is_transfer && !data->set.http_transfer_encoding &&
          (namelen != 7 || !strncasecompare(name, "chunked", 7))) ||
         (!is_transfer && data->set.http_ce_skip)) {
        /* not requested, ignore */
        return CURLE_OK;
      }

      if(Curl_cwriter_count(data, phase) + 1 >= MAX_ENCODE_STACK) {
        failf(data, "Reject response due to more than %u content encodings",
              MAX_ENCODE_STACK);
        return CURLE_BAD_CONTENT_ENCODING;
      }

      cwt = find_unencode_writer(name, namelen, phase);
      if(!cwt)
        cwt = &error_writer;  /* Defer error at use. */

      result = Curl_cwriter_create(&writer, data, cwt, phase);
      if(result)
        return result;

      result = Curl_cwriter_add(data, writer);
      if(result) {
        Curl_cwriter_free(data, writer);
        return result;
      }
    }
  } while(*enclist);

  return CURLE_OK;
}